

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCastDecimalToFloatingPoint<duckdb::hugeint_t,float>
          (duckdb *this,hugeint_t input,float *result,uint8_t scale)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  hugeint_t lhs;
  hugeint_t hVar4;
  hugeint_t div;
  hugeint_t mod;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  
  lhs.upper = input.lower;
  local_60.upper = lhs.upper;
  local_60.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_50,0x1000000);
  bVar1 = hugeint_t::operator<=(&local_60,&local_50);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_40,-0x1000000);
    bVar1 = hugeint_t::operator>=(&local_60,&local_40);
  }
  else {
    bVar1 = false;
  }
  if (((char)result == '\0') || (bVar1 != false)) {
    hVar4.upper = lhs.upper;
    hVar4.lower = (uint64_t)this;
    fVar2 = Cast::Operation<duckdb::hugeint_t,float>(hVar4);
    fVar2 = fVar2 / (float)*(double *)
                            (NumericHelper::DOUBLE_POWERS_OF_TEN + ((ulong)result & 0xff) * 8);
  }
  else {
    hVar4 = *(hugeint_t *)(Hugeint::POWERS_OF_TEN + (uint)((int)((ulong)result & 0xff) << 4));
    hugeint_t::hugeint_t(&local_60,0);
    hugeint_t::hugeint_t(&local_50,0);
    lhs.lower = (uint64_t)this;
    local_60 = Hugeint::DivMod(lhs,hVar4,&local_50);
    fVar2 = Cast::Operation<duckdb::hugeint_t,float>(local_60);
    fVar3 = Cast::Operation<duckdb::hugeint_t,float>(local_50);
    fVar2 = fVar3 / (float)*(double *)
                            (NumericHelper::DOUBLE_POWERS_OF_TEN + ((ulong)result & 0xff) * 8) +
            fVar2;
  }
  *(float *)input.upper = fVar2;
  return true;
}

Assistant:

bool TryCastDecimalToFloatingPoint(SRC input, DST &result, uint8_t scale) {
	if (IsRepresentableExactly<SRC, DST>(input, DST(0.0)) || scale == 0) {
		// Fast path, integer is representable exaclty as a float/double
		result = Cast::Operation<SRC, DST>(input) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
		return true;
	}
	auto power_of_ten = GetPowerOfTen(input, scale);

	SRC div = 0;
	SRC mod = 0;
	GetDivMod(input, power_of_ten, div, mod);

	result = Cast::Operation<SRC, DST>(div) +
	         Cast::Operation<SRC, DST>(mod) / DST(NumericHelper::DOUBLE_POWERS_OF_TEN[scale]);
	return true;
}